

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint *puVar5;
  char **ppcVar6;
  uint uVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar9;
  long lVar10;
  char cVar11;
  byte *pbVar12;
  byte *pbVar13;
  int local_3c;
  uint uVar8;
  
  if (end <= ptr) {
    return -4;
  }
  iVar2 = 0;
  lVar10 = 1;
  puVar5 = &switchD_0045af13::switchdataD_005d3750;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 2:
    pbVar13 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
    switch(bVar1) {
    case 0xf:
      iVar2 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar2;
    case 0x10:
      iVar2 = normal_scanDecl(enc,ptr + 2,end,nextTokPtr);
      return iVar2;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x17:
      goto switchD_0045b2ad_default;
    case 0x16:
    case 0x18:
switchD_0045b283_caseD_16:
      *nextTokPtr = ptr;
      return 0x1d;
    default:
      if ((bVar1 - 5 < 3) || (bVar1 == 0x1d)) goto switchD_0045b283_caseD_16;
switchD_0045b2ad_default:
      *nextTokPtr = ptr + 1;
      return 0;
    }
  default:
switchD_0045af13_caseD_3:
    *nextTokPtr = ptr;
    break;
  case 4:
    pcVar9 = ptr + 1;
    if ((long)end - (long)pcVar9 < 1) {
      iVar2 = -0x1a;
    }
    else {
      if (*pcVar9 == ']') {
        if ((long)end - (long)pcVar9 == 1) {
          return -1;
        }
        if (ptr[2] == '>') {
          *nextTokPtr = ptr + 3;
          return 0x22;
        }
      }
      *nextTokPtr = pcVar9;
      iVar2 = 0x1a;
    }
    break;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar2 = (*enc[3].literalScanners[0])
                      (enc,ptr,end,(char **)&switchD_0045af13::switchdataD_005d3750);
    lVar10 = 2;
    if (iVar2 == 0) {
      iVar2 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX,(char **)puVar5);
      goto LAB_0045b306;
    }
LAB_0045b143:
    local_3c = 0x12;
    iVar2 = 0;
    goto LAB_0045b31e;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar2 = (*enc[3].literalScanners[1])
                      (enc,ptr,end,(char **)&switchD_0045af13::switchdataD_005d3750);
    lVar10 = 3;
    if (iVar2 != 0) goto LAB_0045b143;
    iVar2 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_01,(char **)puVar5);
    goto LAB_0045b306;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar2 = (*enc[3].nameMatchesAscii)(enc,ptr,end,(char *)&switchD_0045af13::switchdataD_005d3750);
    lVar10 = 4;
    if (iVar2 != 0) goto LAB_0045b143;
    iVar2 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_00,(char **)puVar5);
LAB_0045b306:
    if (iVar2 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    local_3c = 0x13;
    iVar2 = -0xff;
    goto LAB_0045b31e;
  case 9:
    if (ptr + 1 == end) {
      *nextTokPtr = end;
      return -0xf;
    }
  case 10:
  case 0x15:
    pbVar13 = (byte *)(ptr + 1);
    lVar10 = (long)end - (long)pbVar13;
    pbVar12 = pbVar13;
    for (; (0 < lVar10 &&
           (((cVar11 = *(char *)((long)enc[1].scanners + (ulong)*pbVar13), cVar11 == '\x15' ||
             (cVar11 == '\n')) ||
            ((pbVar12 = pbVar13, cVar11 == '\t' && (pbVar13 + 1 != (byte *)end))))));
        pbVar13 = pbVar13 + 1) {
      lVar10 = lVar10 + -1;
      pbVar12 = (byte *)end;
    }
    *nextTokPtr = (char *)pbVar12;
    iVar2 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 1;
    iVar2 = 0x11;
    break;
  case 0xc:
    iVar2 = 0xc;
    goto LAB_0045b1b2;
  case 0xd:
    iVar2 = 0xd;
LAB_0045b1b2:
    iVar2 = normal_scanLit(iVar2,enc,ptr + 1,end,nextTokPtr);
    return iVar2;
  case 0x13:
    ptr = ptr + 1;
    uVar4 = (long)end - (long)ptr;
    if ((long)uVar4 < 1) {
      return -1;
    }
    ppcVar6 = (char **)(ulong)(byte)*ptr;
    bVar1 = *(byte *)((long)enc[1].scanners + (long)ppcVar6);
    pcVar9 = (char *)(ulong)bVar1;
    iVar2 = 0;
    if (bVar1 < 7) {
      if (bVar1 == 5) {
        if (uVar4 == 1) {
          return -2;
        }
        iVar3 = (*enc[3].literalScanners[0])(enc,ptr,pcVar9,ppcVar6);
        lVar10 = 2;
      }
      else {
        iVar2 = 0;
        if (bVar1 != 6) goto switchD_0045af13_caseD_3;
        if (uVar4 < 3) {
          return -2;
        }
        iVar3 = (*enc[3].literalScanners[1])(enc,ptr,pcVar9,ppcVar6);
        lVar10 = 3;
      }
LAB_0045b481:
      iVar2 = 0;
      if (iVar3 == 0) goto switchD_0045af13_caseD_3;
    }
    else {
      if (bVar1 == 7) {
        if (uVar4 < 4) {
          return -2;
        }
        iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar9,(char *)ppcVar6);
        lVar10 = 4;
        goto LAB_0045b481;
      }
      lVar10 = 1;
      if ((bVar1 != 0x16) && (bVar1 != 0x18)) goto switchD_0045af13_caseD_3;
    }
    iVar2 = -0x14;
    for (ptr = (char *)((byte *)ptr + lVar10); uVar4 = (long)end - (long)ptr, 0 < (long)uVar4;
        ptr = (char *)((byte *)ptr + lVar10)) {
      uVar8 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      uVar7 = uVar8 - 5;
      if (0x1f < uVar7) {
switchD_0045b4cc_caseD_8:
        iVar2 = 0;
        goto switchD_0045af13_caseD_3;
      }
      lVar10 = 1;
      pcVar9 = (char *)((long)&switchD_0045b4cc::switchdataD_005d385c +
                       (long)(int)(&switchD_0045b4cc::switchdataD_005d385c)[uVar7]);
      switch(uVar8) {
      case 5:
        if (uVar4 == 1) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[0])(enc,ptr,pcVar9,(char **)0x1);
        lVar10 = 2;
        break;
      case 6:
        if (uVar4 < 3) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[1])(enc,ptr,pcVar9,(char **)0x1);
        lVar10 = 3;
        break;
      case 7:
        if (uVar4 < 4) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[2])(enc,ptr,pcVar9,(char **)0x1);
        lVar10 = 4;
        break;
      default:
        goto switchD_0045b4cc_caseD_8;
      case 9:
      case 10:
      case 0xb:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x24:
        iVar2 = 0x14;
        goto switchD_0045af13_caseD_3;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_0045b4cc_caseD_16;
      }
      if (iVar3 == 0) goto switchD_0045b4cc_caseD_8;
switchD_0045b4cc_caseD_16:
    }
    break;
  case 0x14:
    *nextTokPtr = ptr + 1;
    iVar2 = 0x19;
    break;
  case 0x16:
  case 0x18:
    local_3c = 0x12;
    goto LAB_0045b31e;
  case 0x19:
  case 0x1a:
  case 0x1b:
    local_3c = 0x13;
    iVar2 = 1;
LAB_0045b31e:
    pbVar13 = (byte *)(ptr + lVar10);
    uVar4 = (long)end - (long)pbVar13;
    if (0 < (long)uVar4) {
LAB_0045b337:
      uVar8 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
      uVar7 = uVar8 - 5;
      if (0x1f < uVar7) goto switchD_0045b35c_caseD_8;
      lVar10 = 1;
      pcVar9 = (char *)((long)&switchD_0045b35c::switchdataD_005d37dc +
                       (long)(int)(&switchD_0045b35c::switchdataD_005d37dc)[uVar7]);
      cVar11 = (char)iVar2;
      switch(uVar8) {
      case 5:
        if (uVar4 == 1) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[0])(enc,(char *)pbVar13,pcVar9,(char **)0x1);
        lVar10 = 2;
        goto LAB_0045b3b9;
      case 6:
        if (uVar4 < 3) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[1])(enc,(char *)pbVar13,pcVar9,(char **)0x1);
        lVar10 = 3;
        goto LAB_0045b3b9;
      case 7:
        if (uVar4 < 4) {
          return -2;
        }
        iVar3 = (*enc[3].scanners[2])(enc,(char *)pbVar13,pcVar9,(char **)0x1);
        lVar10 = 4;
LAB_0045b3b9:
        if (iVar3 == 0) break;
switchD_0045b35c_caseD_16:
        pbVar13 = pbVar13 + lVar10;
        uVar4 = (long)end - (long)pbVar13;
        if ((long)uVar4 < 1) goto LAB_0045b3cf;
        goto LAB_0045b337;
      case 9:
      case 10:
      case 0xb:
      case 0x14:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x23:
      case 0x24:
        *nextTokPtr = (char *)pbVar13;
        return local_3c;
      case 0xf:
        if (cVar11 == '\0') {
          *nextTokPtr = (char *)(pbVar13 + 1);
          return 0x1e;
        }
        break;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_0045b35c_caseD_16;
      case 0x21:
        if (cVar11 == '\0') {
          *nextTokPtr = (char *)(pbVar13 + 1);
          return 0x1f;
        }
        break;
      case 0x22:
        if (cVar11 == '\0') {
          *nextTokPtr = (char *)(pbVar13 + 1);
          return 0x20;
        }
      }
switchD_0045b35c_caseD_8:
      *nextTokPtr = (char *)pbVar13;
      return 0;
    }
LAB_0045b3cf:
    iVar2 = -local_3c;
    break;
  case 0x1e:
    iVar2 = normal_scanPercent(enc,ptr + 1,end,nextTokPtr);
    return iVar2;
  case 0x1f:
    *nextTokPtr = ptr + 1;
    iVar2 = 0x17;
    break;
  case 0x20:
    pbVar13 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
      return -0x18;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
    if (bVar1 < 0x20) {
      if (2 < bVar1 - 9) {
        if (bVar1 == 0xf) {
          *nextTokPtr = ptr + 2;
          return 0x23;
        }
        if (bVar1 != 0x15) goto switchD_0045b2ad_default;
      }
switchD_0045b2ad_caseD_20:
      *nextTokPtr = (char *)pbVar13;
      iVar2 = 0x18;
    }
    else {
      switch(bVar1) {
      case 0x20:
      case 0x23:
      case 0x24:
        goto switchD_0045b2ad_caseD_20;
      case 0x21:
        *nextTokPtr = ptr + 2;
        iVar2 = 0x24;
        break;
      case 0x22:
        *nextTokPtr = ptr + 2;
        iVar2 = 0x25;
        break;
      default:
        goto switchD_0045b2ad_default;
      }
    }
    break;
  case 0x23:
    *nextTokPtr = ptr + 1;
    iVar2 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 1;
    iVar2 = 0x15;
  }
  return iVar2;
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr)
{
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT:
    {
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_EXCL:
        return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_QUEST:
        return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_NMSTRT:
      case BT_HEX:
      case BT_NONASCII:
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
        *nextTokPtr = ptr - MINBPC(enc);
        return XML_TOK_INSTANCE_START;
      }
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S: case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2*MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR: case BT_LF: case BT_S:
    case BT_GT: case BT_COMMA: case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#define LEAD_CASE(n) \
  case BT_LEAD ## n: \
    if (end - ptr < n) \
      return XML_TOK_PARTIAL_CHAR; \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NAME; \
      break; \
    } \
    if (IS_NAME_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NMTOKEN; \
      break; \
    } \
    *nextTokPtr = ptr; \
    return XML_TOK_INVALID;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#ifdef XML_NS
  case BT_COLON:
#endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT: case BT_RPAR: case BT_COMMA:
    case BT_VERBAR: case BT_LSQB: case BT_PERCNT:
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}